

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileCommand.cxx
# Opt level: O0

void __thiscall cmFileInstaller::cmFileInstaller(cmFileInstaller *this,cmFileCommand *command)

{
  cmMakefile *this_00;
  bool bVar1;
  char *pcVar2;
  allocator local_69;
  string local_68;
  undefined1 local_38 [8];
  string install_always;
  cmFileCommand *command_local;
  cmFileInstaller *this_local;
  
  install_always.field_2._8_8_ = command;
  cmFileCopier::cmFileCopier(&this->super_cmFileCopier,command,"INSTALL");
  (this->super_cmFileCopier)._vptr_cmFileCopier = (_func_int **)&PTR__cmFileInstaller_00bf2088;
  *(undefined4 *)&(this->super_cmFileCopier).field_0xc4 = 4;
  this->Optional = false;
  this->MessageAlways = false;
  this->MessageLazy = false;
  this->MessageNever = false;
  this->DestDirLength = 0;
  std::__cxx11::string::string((string *)&this->Rename);
  std::__cxx11::string::string((string *)&this->Manifest);
  (this->super_cmFileCopier).UseSourcePermissions = false;
  std::__cxx11::string::string((string *)local_38);
  bVar1 = cmsys::SystemTools::GetEnv("CMAKE_INSTALL_ALWAYS",(string *)local_38);
  if (bVar1) {
    pcVar2 = (char *)std::__cxx11::string::c_str();
    bVar1 = cmSystemTools::IsOn(pcVar2);
    (this->super_cmFileCopier).Always = bVar1;
  }
  this_00 = (this->super_cmFileCopier).Makefile;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_68,"CMAKE_INSTALL_MANIFEST_FILES",&local_69);
  pcVar2 = cmMakefile::GetSafeDefinition(this_00,&local_68);
  std::__cxx11::string::operator=((string *)&this->Manifest,pcVar2);
  std::__cxx11::string::~string((string *)&local_68);
  std::allocator<char>::~allocator((allocator<char> *)&local_69);
  std::__cxx11::string::~string((string *)local_38);
  return;
}

Assistant:

cmFileInstaller(cmFileCommand* command)
    : cmFileCopier(command, "INSTALL")
    , InstallType(cmInstallType_FILES)
    , Optional(false)
    , MessageAlways(false)
    , MessageLazy(false)
    , MessageNever(false)
    , DestDirLength(0)
  {
    // Installation does not use source permissions by default.
    this->UseSourcePermissions = false;
    // Check whether to copy files always or only if they have changed.
    std::string install_always;
    if (cmSystemTools::GetEnv("CMAKE_INSTALL_ALWAYS", install_always)) {
      this->Always = cmSystemTools::IsOn(install_always.c_str());
    }
    // Get the current manifest.
    this->Manifest =
      this->Makefile->GetSafeDefinition("CMAKE_INSTALL_MANIFEST_FILES");
  }